

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffcdfl(fitsfile *fptr,int *status)

{
  long lVar1;
  int iVar2;
  FITSfile *pFVar3;
  long lVar4;
  char *errmsg;
  char chbuff [2880];
  char local_b58 [2880];
  
  if (0 < *status) {
    return *status;
  }
  pFVar3 = fptr->Fptr;
  if (fptr->HDUposition != pFVar3->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar3 = fptr->Fptr;
  }
  if (pFVar3->heapstart != 0) {
    lVar4 = pFVar3->heapstart + pFVar3->datastart + pFVar3->heapsize;
    lVar1 = lVar4 + ((lVar4 + 0xb3f) / 0xb40) * -0xb40;
    if (lVar1 != 0) {
      ffmbyt(fptr,lVar4,0,status);
      iVar2 = ffgbyt(fptr,-lVar1,local_b58,status);
      if (iVar2 < 1) {
        pFVar3 = fptr->Fptr;
        lVar4 = 0;
        do {
          if ((uint)(pFVar3->hdutype == 1) << 5 != (int)local_b58[lVar4]) {
            *status = 0xff;
            errmsg = "Warning: remaining bytes following data are not filled with zeros.";
            if (pFVar3->hdutype == 1) {
              errmsg = 
              "Warning: remaining bytes following ASCII table data are not filled with blanks.";
            }
            goto LAB_00184b18;
          }
          lVar4 = lVar4 + 1;
        } while (-lVar4 != lVar1);
      }
      else {
        errmsg = "Error reading data unit fill bytes (ffcdfl).";
LAB_00184b18:
        ffxmsg(5,errmsg);
      }
    }
  }
  return *status;
}

Assistant:

int ffcdfl( fitsfile *fptr, int *status)
{
   int nfill,i;
   LONGLONG filpos;
   char chfill,chbuff[2880];

   if( *status > 0 ) return( *status );

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

   /*   check if the data unit is null   */
   if( (fptr->Fptr)->heapstart==0 ) return( *status );

   /* calculate starting position of the fill bytes, if any */
   filpos = (fptr->Fptr)->datastart 
          + (fptr->Fptr)->heapstart 
          + (fptr->Fptr)->heapsize;

   /*   calculate the number of fill bytes   */
   nfill = (long) ((filpos + 2879) / 2880 * 2880 - filpos);
   if( nfill == 0 ) return( *status );

   /*   move to the beginning of the fill bytes   */
   ffmbyt(fptr, filpos, FALSE, status);

   if( ffgbyt(fptr, nfill, chbuff, status) > 0)
   {
      ffpmsg("Error reading data unit fill bytes (ffcdfl).");
      return( *status );
   }

   if( (fptr->Fptr)->hdutype==ASCII_TBL )
      chfill = 32;         /* ASCII tables are filled with spaces */
   else
      chfill = 0;          /* all other extensions are filled with zeros */
   
   /*   check for all zeros or blanks   */
   
   for(i=0;i<nfill;i++) {
      if( chbuff[i] != chfill ) {
         *status=BAD_DATA_FILL;
         if( (fptr->Fptr)->hdutype==ASCII_TBL )
            ffpmsg("Warning: remaining bytes following ASCII table data are not filled with blanks.");
         else
            ffpmsg("Warning: remaining bytes following data are not filled with zeros.");
         return( *status );
      }
   }
   return( *status );
}